

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O1

void __thiscall
chrono::ChArchiveAsciiDump::out(ChArchiveAsciiDump *this,ChValue *bVal,bool tracked,size_t obj_ID)

{
  undefined1 *puVar1;
  ChStreamOutAscii *pCVar2;
  undefined4 extraout_var;
  int iVar3;
  
  if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
    iVar3 = 0;
    do {
      chrono::ChStreamOutAscii::operator<<(this->ostream,"\t");
      iVar3 = iVar3 + 1;
    } while (iVar3 < *(int *)&(this->super_ChArchiveOut).field_0x104);
  }
  if (this->suppress_names == false) {
    pCVar2 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(this->ostream,(bVal->_name)._M_dataplus._M_p);
    chrono::ChStreamOutAscii::operator<<(pCVar2,"  ");
  }
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream,"[");
  iVar3 = (*bVal->_vptr_ChValue[5])(bVal);
  pCVar2 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar2,(char *)CONCAT44(extraout_var,iVar3));
  chrono::ChStreamOutAscii::operator<<(pCVar2,"]");
  if (tracked) {
    pCVar2 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(this->ostream," (tracked)   ID= ");
    chrono::ChStreamOutAscii::operator<<(pCVar2,obj_ID);
  }
  if ((this->super_ChArchiveOut).super_ChArchive.use_versions == true) {
    pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream," version=");
    iVar3 = (*bVal->_vptr_ChValue[4])(bVal);
    chrono::ChStreamOutAscii::operator<<(pCVar2,iVar3);
  }
  chrono::ChStreamOutAscii::operator<<(this->ostream," \n");
  puVar1 = &(this->super_ChArchiveOut).field_0x104;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  (*bVal->_vptr_ChValue[0xd])(bVal,this);
  puVar1 = &(this->super_ChArchiveOut).field_0x104;
  *(int *)puVar1 = *(int *)puVar1 + -1;
  return;
}

Assistant:

virtual void out     (ChValue& bVal, bool tracked, size_t obj_ID) {
            indent();
            if (!suppress_names) 
                (*ostream) << bVal.name() << "  "; 
            (*ostream) << "[" << bVal.GetTypeidName() << "]";
            if (tracked)
                (*ostream) << " (tracked)   ID= " << obj_ID; 
            if (this->use_versions)
                (*ostream) << " version=" << bVal.GetClassRegisteredVersion();
            (*ostream) << " \n";
            ++tablevel;
            bVal.CallArchiveOut(*this);
            --tablevel;
      }